

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_fwd_txfm.c
# Opt level: O0

void highbd_fwd_txfm_4x4(int16_t *src_diff,tran_low_t *coeff,int diff_stride,TxfmParam *txfm_param)

{
  TX_TYPE *in_RCX;
  int in_EDX;
  int32_t *in_RSI;
  int16_t *in_RDI;
  int bd;
  TX_TYPE tx_type;
  int32_t *dst_coeff;
  
  if (*(int *)(in_RCX + 4) == 0) {
    (*av1_fwd_txfm2d_4x4)(in_RDI,in_RSI,in_EDX,*in_RCX,*(int *)(in_RCX + 8));
  }
  else {
    (*av1_fwht4x4)(in_RDI,in_RSI,in_EDX);
  }
  return;
}

Assistant:

static void highbd_fwd_txfm_4x4(const int16_t *src_diff, tran_low_t *coeff,
                                int diff_stride, TxfmParam *txfm_param) {
  int32_t *dst_coeff = (int32_t *)coeff;
  const TX_TYPE tx_type = txfm_param->tx_type;
  const int bd = txfm_param->bd;
  if (txfm_param->lossless) {
    assert(tx_type == DCT_DCT);
    av1_fwht4x4(src_diff, coeff, diff_stride);
    return;
  }
  av1_fwd_txfm2d_4x4(src_diff, dst_coeff, diff_stride, tx_type, bd);
}